

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O1

int Minisat::parseInt<Minisat::StreamBuffer>(StreamBuffer *in)

{
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  int iVar3;
  int iVar4;
  bool bVar5;
  
  skipWhitespace<Minisat::StreamBuffer>(in);
  iVar2 = in->pos;
  if (iVar2 < in->size) {
    bVar5 = in->buf[iVar2] == '-';
  }
  else {
    bVar5 = false;
  }
  if ((bVar5) || ((iVar2 < in->size && (in->buf[iVar2] == '+')))) {
    in->pos = iVar2 + 1;
    StreamBuffer::assureLookahead(in);
  }
  iVar2 = in->pos;
  if (((in->size <= iVar2) || (in->buf[iVar2] < 0x30)) ||
     ((iVar2 < in->size && (0x39 < in->buf[iVar2])))) {
    parseInt<Minisat::StreamBuffer>();
    return extraout_EAX;
  }
  iVar2 = in->pos;
  iVar4 = 0;
  bVar1 = iVar2 < in->size;
  if (iVar2 < in->size) {
    iVar4 = 0;
    do {
      if ((in->buf[iVar2] < 0x30) || ((bVar1 && (0x39 < in->buf[iVar2])))) break;
      iVar3 = -0x31;
      if (bVar1) {
        iVar3 = in->buf[iVar2] - 0x30;
      }
      iVar4 = iVar4 * 10 + iVar3;
      in->pos = iVar2 + 1;
      StreamBuffer::assureLookahead(in);
      iVar2 = in->pos;
      bVar1 = iVar2 < in->size;
    } while (iVar2 < in->size);
  }
  iVar2 = -iVar4;
  if (!bVar5) {
    iVar2 = iVar4;
  }
  return iVar2;
}

Assistant:

static int parseInt(B& in) {
    int     val = 0;
    bool    neg = false;
    skipWhitespace(in);
    if      (*in == '-') neg = true, ++in;
    else if (*in == '+') ++in;
    if (*in < '0' || *in > '9') fprintf(stderr, "PARSE ERROR! Unexpected char: %c\n", *in), exit(3);
    while (*in >= '0' && *in <= '9')
        val = val*10 + (*in - '0'),
        ++in;
    return neg ? -val : val; }